

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aierror.cpp
# Opt level: O2

void __thiscall
Test_aierror_formatErrno_Test::Test_aierror_formatErrno_Test(Test_aierror_formatErrno_Test *this)

{
  Test_aierror::Test_aierror(&this->super_Test_aierror);
  (this->super_Test_aierror).super_Test._vptr_Test = (_func_int **)&PTR__Test_0013cb50;
  return;
}

Assistant:

TEST_F(Test_aierror, formatErrno) {
#ifdef _MSC_VER
    for (auto i=0;i<20;i++)
    {
        _set_errno(i);
        auto str_default = ai::stringFromErrno();
        auto str_explicit = ai::stringFromErrno(i);
        auto fmt_default = ai::formatErrno();
        auto fmt_explicit = ai::formatErrno(i);
        ASSERT_TRUE(fmt_default.find(str_default) > 0);
        ASSERT_TRUE(fmt_explicit.find(str_explicit) > 0);
    }
#endif
}